

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_database.cc
# Opt level: O0

bool __thiscall
google::protobuf::EncodedDescriptorDatabase::FindNameOfFileContainingSymbol
          (EncodedDescriptorDatabase *this,string *symbol_name,string *output)

{
  string *in_RDX;
  pair<const_void_*,_int> pVar1;
  FileDescriptorProto file_proto;
  uint32 kNameTag;
  CodedInputStream input;
  pair<const_void_*,_int> encoded_file;
  uint32 v;
  string *in_stack_fffffffffffffe48;
  FileDescriptorProto *in_stack_fffffffffffffe50;
  undefined6 in_stack_fffffffffffffe58;
  undefined1 in_stack_fffffffffffffe5e;
  undefined1 in_stack_fffffffffffffe5f;
  undefined4 in_stack_fffffffffffffe60;
  uint32 in_stack_fffffffffffffe64;
  CodedInputStream *this_00;
  MessageLite *in_stack_fffffffffffffe70;
  FileDescriptorProto *in_stack_fffffffffffffea0;
  uint32 in_stack_fffffffffffffec4;
  CodedInputStream *in_stack_fffffffffffffec8;
  CodedInputStream local_a0;
  uint8 *local_50;
  int local_48;
  uint8 *local_40;
  int local_38;
  string *local_30;
  byte local_15;
  uint local_14;
  CodedInputStream *local_10;
  uint local_4;
  
  local_30 = in_RDX;
  pVar1 = SimpleDescriptorDatabase::DescriptorIndex<std::pair<const_void_*,_int>_>::FindSymbol
                    ((DescriptorIndex<std::pair<const_void_*,_int>_> *)
                     CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
                     (string *)
                     CONCAT17(in_stack_fffffffffffffe5f,
                              CONCAT16(in_stack_fffffffffffffe5e,in_stack_fffffffffffffe58)));
  local_50 = (uint8 *)pVar1.first;
  local_48 = pVar1.second;
  if (local_50 == (uint8 *)0x0) {
    local_15 = 0;
  }
  else {
    local_40 = local_50;
    local_38 = local_48;
    io::CodedInputStream::CodedInputStream(&local_a0,local_50,local_48);
    this_00 = &local_a0;
    local_14 = 0;
    local_10 = this_00;
    if ((local_a0.buffer_ < local_a0.buffer_end_) &&
       (local_14 = (uint)*local_a0.buffer_, local_14 < 0x80)) {
      io::CodedInputStream::Advance(this_00,1);
    }
    else {
      in_stack_fffffffffffffe64 =
           io::CodedInputStream::ReadTagFallback
                     (in_stack_fffffffffffffec8,in_stack_fffffffffffffec4);
      local_14 = in_stack_fffffffffffffe64;
    }
    local_4 = local_14;
    if (local_14 == 10) {
      local_15 = internal::WireFormatLite::ReadString
                           ((CodedInputStream *)in_stack_fffffffffffffe50,in_stack_fffffffffffffe48)
      ;
    }
    else {
      FileDescriptorProto::FileDescriptorProto(in_stack_fffffffffffffea0);
      local_15 = MessageLite::ParseFromArray
                           (in_stack_fffffffffffffe70,this_00,in_stack_fffffffffffffe64);
      if ((bool)local_15) {
        in_stack_fffffffffffffe50 =
             (FileDescriptorProto *)
             FileDescriptorProto::name_abi_cxx11_((FileDescriptorProto *)0x54d8d5);
        std::__cxx11::string::operator=(local_30,(string *)in_stack_fffffffffffffe50);
      }
      FileDescriptorProto::~FileDescriptorProto(in_stack_fffffffffffffe50);
    }
    io::CodedInputStream::~CodedInputStream((CodedInputStream *)in_stack_fffffffffffffe50);
  }
  return (bool)(local_15 & 1);
}

Assistant:

bool EncodedDescriptorDatabase::FindNameOfFileContainingSymbol(
    const std::string& symbol_name, std::string* output) {
  std::pair<const void*, int> encoded_file = index_.FindSymbol(symbol_name);
  if (encoded_file.first == NULL) return false;

  // Optimization:  The name should be the first field in the encoded message.
  //   Try to just read it directly.
  io::CodedInputStream input(reinterpret_cast<const uint8*>(encoded_file.first),
                             encoded_file.second);

  const uint32 kNameTag = internal::WireFormatLite::MakeTag(
      FileDescriptorProto::kNameFieldNumber,
      internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED);

  if (input.ReadTagNoLastTag() == kNameTag) {
    // Success!
    return internal::WireFormatLite::ReadString(&input, output);
  } else {
    // Slow path.  Parse whole message.
    FileDescriptorProto file_proto;
    if (!file_proto.ParseFromArray(encoded_file.first, encoded_file.second)) {
      return false;
    }
    *output = file_proto.name();
    return true;
  }
}